

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Method.cpp
# Opt level: O0

Oop __thiscall Lodtalk::CompiledMethod::dump(CompiledMethod *this)

{
  uint8_t *buffer;
  size_t size;
  anon_union_8_4_0eb573b0_for_Oop_0 aVar1;
  CompiledMethod *this_local;
  
  buffer = getFirstBCPointer(this);
  size = getByteDataSize(this);
  dumpSistaBytecode(buffer,size);
  aVar1 = (anon_union_8_4_0eb573b0_for_Oop_0)ProtoObject::selfOop((ProtoObject *)this);
  return (Oop)aVar1.pointer;
}

Assistant:

Oop CompiledMethod::dump()
{
    dumpSistaBytecode(getFirstBCPointer(), getByteDataSize());
    return selfOop();
}